

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::InlinedStringIndex
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32_t *puVar1;
  char *pcVar2;
  int in_EDX;
  LogMessageFatal LStack_18;
  
  if (this->inlined_string_donated_offset_ != -1) {
    puVar1 = this->inlined_string_indices_;
    pcVar2 = FieldDescriptor::index(field,(char *)field,in_EDX);
    return puVar1[(int)pcVar2];
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.h"
             ,0xb7,"HasInlinedString()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

bool HasInlinedString() const { return inlined_string_donated_offset_ != -1; }